

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O2

int __thiscall
sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
::remove(LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
         *this,char *__filename)

{
  CacheNode *this_00;
  CacheNode *pCVar1;
  CacheNode *pCVar2;
  int extraout_EAX;
  Node *pNVar3;
  CacheNode **ppCVar4;
  
  pNVar3 = map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
           ::search(&this->table,(long *)__filename);
  if (pNVar3 != (this->table).nil) {
    this_00 = pNVar3->value->second;
    pCVar1 = this_00->prec;
    ppCVar4 = &pCVar1->succ;
    if (pCVar1 == (CacheNode *)0x0) {
      ppCVar4 = &this->head;
    }
    pCVar2 = this_00->succ;
    *ppCVar4 = pCVar2;
    ppCVar4 = &pCVar2->prec;
    if (pCVar2 == (CacheNode *)0x0) {
      ppCVar4 = &this->tail;
    }
    *ppCVar4 = pCVar1;
    CacheNode::~CacheNode(this_00);
    operator_delete(this_00,0x670);
    return extraout_EAX;
  }
  return (int)pNVar3;
}

Assistant:

void remove(const locType &offset)
		{
			typename map<locType , CacheNode*>::iterator it = table.find(offset);
			if (it != table.end())
			{
				CacheNode *node = it -> second;
				if (node -> prec) node -> prec -> succ = node -> succ;
				else head = node -> succ;
				if (node -> succ) node -> succ -> prec = node -> prec;
				else tail = node -> prec;
				delete node;
			}
		}